

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fits_hdecompress.c
# Opt level: O2

void qtree_bitins64(uchar *a,int nx,int ny,LONGLONG *b,int n,int bit)

{
  ulong *puVar1;
  ulong uVar2;
  ulong uVar3;
  ulong uVar4;
  long lVar5;
  int iVar6;
  byte *pbVar7;
  int iVar8;
  int iVar9;
  long lVar10;
  int iVar11;
  ulong uVar12;
  int iVar13;
  long lVar14;
  long lVar15;
  long lVar16;
  undefined1 auVar17 [16];
  
  uVar12 = 1L << ((byte)bit & 0x3f);
  auVar17._8_4_ = (int)uVar12;
  auVar17._0_8_ = uVar12;
  auVar17._12_4_ = (int)(uVar12 >> 0x20);
  iVar9 = 0;
  iVar13 = 0;
  iVar11 = 0;
  iVar6 = n;
  do {
    uVar3 = (ulong)iVar9;
    lVar5 = (long)iVar13;
    if (nx + -1 <= iVar11) {
      if (iVar11 < nx) {
        lVar16 = uVar3 << 0x20;
        pbVar7 = a + lVar5;
        lVar5 = lVar5 << 0x20;
        uVar4 = uVar3;
        for (lVar15 = 0; (int)lVar15 < ny + -1; lVar15 = lVar15 + 2) {
          if (*pbVar7 - 4 < 0xc) {
            uVar2 = uVar3 + lVar15;
            switch((uint)*pbVar7) {
            default:
              uVar2 = uVar4 | 1;
              break;
            case 8:
            case 9:
            case 10:
            case 0xb:
              break;
            case 0xc:
            case 0xd:
            case 0xe:
            case 0xf:
              b[uVar3 + lVar15 + 1] = b[uVar3 + lVar15 + 1] | uVar12;
            }
            b[uVar2] = b[uVar2] | uVar12;
          }
          uVar4 = uVar4 + 2;
          lVar16 = lVar16 + 0x200000000;
          lVar5 = lVar5 + 0x100000000;
          pbVar7 = pbVar7 + 1;
        }
        if (((int)lVar15 < ny) && ((a[lVar5 >> 0x20] & 0xf8) == 8)) {
          puVar1 = (ulong *)((long)b + (lVar16 >> 0x1d));
          *puVar1 = *puVar1 | uVar12;
        }
      }
      return;
    }
    lVar16 = uVar3 << 0x20;
    lVar15 = (long)n;
    pbVar7 = a + lVar5;
    lVar5 = lVar5 << 0x20;
    lVar14 = 8;
    uVar4 = uVar3;
    for (lVar10 = 0; iVar8 = (int)lVar10, iVar8 < ny + -1; lVar10 = lVar10 + 2) {
      if (0xe < *pbVar7 - 1) goto LAB_001b6ef0;
      puVar1 = (ulong *)(b + uVar4 + 1);
      switch((uint)*pbVar7) {
      case 1:
        puVar1 = (ulong *)((long)b + lVar14 + uVar3 * 8 + lVar15 * 8);
        break;
      case 2:
        puVar1 = (ulong *)(b + (long)n + uVar4);
        break;
      case 3:
        puVar1 = (ulong *)(b + (long)n + uVar4);
      case 5:
        b[lVar15 + uVar3 + lVar10 + 1] = b[lVar15 + uVar3 + lVar10 + 1] | uVar12;
        break;
      case 6:
        b[lVar15 + uVar3 + lVar10] = b[lVar15 + uVar3 + lVar10] | uVar12;
        break;
      case 7:
        *(undefined1 (*) [16])(b + lVar15 + uVar3 + lVar10) =
             *(undefined1 (*) [16])(b + lVar15 + uVar3 + lVar10) | auVar17;
        break;
      case 8:
        goto switchD_001b6e93_caseD_8;
      case 9:
        b[lVar15 + uVar3 + lVar10 + 1] = b[lVar15 + uVar3 + lVar10 + 1] | uVar12;
        goto switchD_001b6e93_caseD_8;
      case 10:
        b[lVar15 + uVar3 + lVar10] = b[lVar15 + uVar3 + lVar10] | uVar12;
        goto switchD_001b6e93_caseD_8;
      case 0xb:
        *(undefined1 (*) [16])(b + lVar15 + uVar3 + lVar10) =
             *(undefined1 (*) [16])(b + lVar15 + uVar3 + lVar10) | auVar17;
        goto switchD_001b6e93_caseD_8;
      case 0xc:
        goto switchD_001b6e93_caseD_c;
      case 0xd:
        b[lVar15 + uVar3 + lVar10 + 1] = b[lVar15 + uVar3 + lVar10 + 1] | uVar12;
        goto switchD_001b6e93_caseD_c;
      case 0xe:
        b[lVar15 + uVar3 + lVar10] = b[lVar15 + uVar3 + lVar10] | uVar12;
        goto switchD_001b6e93_caseD_c;
      case 0xf:
        *(undefined1 (*) [16])(b + lVar15 + uVar3 + lVar10) =
             *(undefined1 (*) [16])(b + lVar15 + uVar3 + lVar10) | auVar17;
switchD_001b6e93_caseD_c:
        b[uVar3 + lVar10 + 1] = b[uVar3 + lVar10 + 1] | uVar12;
switchD_001b6e93_caseD_8:
        puVar1 = (ulong *)(b + uVar4);
      }
      *puVar1 = *puVar1 | uVar12;
LAB_001b6ef0:
      uVar4 = uVar4 + 2;
      lVar16 = lVar16 + 0x200000000;
      lVar14 = lVar14 + 0x10;
      lVar5 = lVar5 + 0x100000000;
      iVar13 = iVar13 + 1;
      pbVar7 = pbVar7 + 1;
    }
    if (iVar8 < ny) {
      switch(a[lVar5 >> 0x20]) {
      case '\x02':
      case '\x03':
      case '\x06':
      case '\a':
        lVar16 = (long)(iVar8 + iVar6) * 8;
        break;
      default:
        goto switchD_001b6f7f_caseD_4;
      case '\n':
      case '\v':
      case '\x0e':
      case '\x0f':
        b[iVar8 + iVar6] = b[iVar8 + iVar6] | uVar12;
      case '\b':
      case '\t':
      case '\f':
      case '\r':
        lVar16 = lVar16 >> 0x1d;
      }
      *(ulong *)(lVar16 + (long)b) = *(ulong *)(lVar16 + (long)b) | uVar12;
switchD_001b6f7f_caseD_4:
      iVar13 = iVar13 + 1;
    }
    iVar11 = iVar11 + 2;
    iVar9 = iVar9 + n * 2;
    iVar6 = iVar6 + n * 2;
  } while( true );
}

Assistant:

static void
qtree_bitins64(unsigned char a[], int nx, int ny, LONGLONG b[], int n, int bit)
/*
   int n;		declared y dimension of b
*/
{
int i, j, k;
int s00;
LONGLONG plane_val;

	plane_val = ((LONGLONG) 1) << bit;

	/*
	 * expand each 2x2 block
	 */
	k = 0;							/* k   is index of a[i/2,j/2]	*/
	for (i = 0; i<nx-1; i += 2) {
		s00 = n*i;					/* s00 is index of b[i,j]		*/

  /* Note:
     this code appears to run very slightly faster on a 32-bit linux
     machine using s00+n rather than the s10 intermediate variable
  */
  /*		s10 = s00+n;	*/			/* s10 is index of b[i+1,j]	*/
		for (j = 0; j<ny-1; j += 2) {

		    switch (a[k]) {
		    case(0):
			break;
		    case(1):
			b[s00+n+1] |= plane_val;
			break;
		    case(2):
			b[s00+n  ] |= plane_val;
			break;
		    case(3):
			b[s00+n+1] |= plane_val;
			b[s00+n  ] |= plane_val;
			break;
		    case(4):
			b[s00+1] |= plane_val;
			break;
		    case(5):
			b[s00+n+1] |= plane_val;
			b[s00+1] |= plane_val;
			break;
		    case(6):
			b[s00+n  ] |= plane_val;
			b[s00+1] |= plane_val;
			break;
		    case(7):
			b[s00+n+1] |= plane_val;
			b[s00+n  ] |= plane_val;
			b[s00+1] |= plane_val;
			break;
		    case(8):
			b[s00  ] |= plane_val;
			break;
		    case(9):
			b[s00+n+1] |= plane_val;
			b[s00  ] |= plane_val;
			break;
		    case(10):
			b[s00+n  ] |= plane_val;
			b[s00  ] |= plane_val;
			break;
		    case(11):
			b[s00+n+1] |= plane_val;
			b[s00+n  ] |= plane_val;
			b[s00  ] |= plane_val;
			break;
		    case(12):
			b[s00+1] |= plane_val;
			b[s00  ] |= plane_val;
			break;
		    case(13):
			b[s00+n+1] |= plane_val;
			b[s00+1] |= plane_val;
			b[s00  ] |= plane_val;
			break;
		    case(14):
			b[s00+n  ] |= plane_val;
			b[s00+1] |= plane_val;
			b[s00  ] |= plane_val;
			break;
		    case(15):
			b[s00+n+1] |= plane_val;
			b[s00+n  ] |= plane_val;
			b[s00+1] |= plane_val;
			b[s00  ] |= plane_val;
			break;
		    }

/*
			b[s10+1] |= ((LONGLONG) ( a[k]     & 1)) << bit;
			b[s10  ] |= ((((LONGLONG)a[k])>>1) & 1) << bit;
			b[s00+1] |= ((((LONGLONG)a[k])>>2) & 1) << bit;
			b[s00  ] |= ((((LONGLONG)a[k])>>3) & 1) << bit;
*/
			s00 += 2;
/*			s10 += 2;  */
			k += 1;
		}
		if (j < ny) {
			/*
			 * row size is odd, do last element in row
			 * s00+1, s10+1 are off edge
			 */

		    switch (a[k]) {
		    case(0):
			break;
		    case(1):
			break;
		    case(2):
			b[s00+n  ] |= plane_val;
			break;
		    case(3):
			b[s00+n  ] |= plane_val;
			break;
		    case(4):
			break;
		    case(5):
			break;
		    case(6):
			b[s00+n  ] |= plane_val;
			break;
		    case(7):
			b[s00+n  ] |= plane_val;
			break;
		    case(8):
			b[s00  ] |= plane_val;
			break;
		    case(9):
			b[s00  ] |= plane_val;
			break;
		    case(10):
			b[s00+n  ] |= plane_val;
			b[s00  ] |= plane_val;
			break;
		    case(11):
			b[s00+n  ] |= plane_val;
			b[s00  ] |= plane_val;
			break;
		    case(12):
			b[s00  ] |= plane_val;
			break;
		    case(13):
			b[s00  ] |= plane_val;
			break;
		    case(14):
			b[s00+n  ] |= plane_val;
			b[s00  ] |= plane_val;
			break;
		    case(15):
			b[s00+n  ] |= plane_val;
			b[s00  ] |= plane_val;
			break;
		    }
/*
			b[s10  ] |= ((((LONGLONG)a[k])>>1) & 1) << bit;
			b[s00  ] |= ((((LONGLONG)a[k])>>3) & 1) << bit;
*/
			k += 1;
		}
	}
	if (i < nx) {
		/*
		 * column size is odd, do last row
		 * s10, s10+1 are off edge
		 */
		s00 = n*i;
		for (j = 0; j<ny-1; j += 2) {

		    switch (a[k]) {
		    case(0):
			break;
		    case(1):
			break;
		    case(2):
			break;
		    case(3):
			break;
		    case(4):
			b[s00+1] |= plane_val;
			break;
		    case(5):
			b[s00+1] |= plane_val;
			break;
		    case(6):
			b[s00+1] |= plane_val;
			break;
		    case(7):
			b[s00+1] |= plane_val;
			break;
		    case(8):
			b[s00  ] |= plane_val;
			break;
		    case(9):
			b[s00  ] |= plane_val;
			break;
		    case(10):
			b[s00  ] |= plane_val;
			break;
		    case(11):
			b[s00  ] |= plane_val;
			break;
		    case(12):
			b[s00+1] |= plane_val;
			b[s00  ] |= plane_val;
			break;
		    case(13):
			b[s00+1] |= plane_val;
			b[s00  ] |= plane_val;
			break;
		    case(14):
			b[s00+1] |= plane_val;
			b[s00  ] |= plane_val;
			break;
		    case(15):
			b[s00+1] |= plane_val;
			b[s00  ] |= plane_val;
			break;
		    }

/*
			b[s00+1] |= ((((LONGLONG)a[k])>>2) & 1) << bit;
			b[s00  ] |= ((((LONGLONG)a[k])>>3) & 1) << bit;
*/
			s00 += 2;
			k += 1;
		}
		if (j < ny) {
			/*
			 * both row and column size are odd, do corner element
			 * s00+1, s10, s10+1 are off edge
			 */

		    switch (a[k]) {
		    case(0):
			break;
		    case(1):
			break;
		    case(2):
			break;
		    case(3):
			break;
		    case(4):
			break;
		    case(5):
			break;
		    case(6):
			break;
		    case(7):
			break;
		    case(8):
			b[s00  ] |= plane_val;
			break;
		    case(9):
			b[s00  ] |= plane_val;
			break;
		    case(10):
			b[s00  ] |= plane_val;
			break;
		    case(11):
			b[s00  ] |= plane_val;
			break;
		    case(12):
			b[s00  ] |= plane_val;
			break;
		    case(13):
			b[s00  ] |= plane_val;
			break;
		    case(14):
			b[s00  ] |= plane_val;
			break;
		    case(15):
			b[s00  ] |= plane_val;
			break;
		    }
/*
			b[s00  ] |= ((((LONGLONG)a[k])>>3) & 1) << bit;
*/
			k += 1;
		}
	}
}